

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

void png_safe_warning(png_structp png_nonconst_ptr,png_const_charp warning_message)

{
  png_voidp pvVar1;
  
  pvVar1 = png_nonconst_ptr->error_ptr;
  if (*(int *)((long)pvVar1 + 0x20) == 0) {
    png_safecat((png_charp)((long)pvVar1 + 0x24),0x40,0,warning_message);
    *(byte *)((long)pvVar1 + 0x20) = *(byte *)((long)pvVar1 + 0x20) | 1;
  }
  return;
}

Assistant:

void /* PRIVATE */ PNGCBAPI
png_safe_warning(png_structp png_nonconst_ptr, png_const_charp warning_message)
{
   png_const_structrp png_ptr = png_nonconst_ptr;
   png_imagep image = png_voidcast(png_imagep, png_ptr->error_ptr);

   /* A warning is only logged if there is no prior warning or error. */
   if (image->warning_or_error == 0)
   {
      png_safecat(image->message, (sizeof image->message), 0, warning_message);
      image->warning_or_error |= PNG_IMAGE_WARNING;
   }
}